

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmGlobalNinjaGenerator::WriteTargetHelp(cmGlobalNinjaGenerator *this,ostream *os)

{
  type os_00;
  allocator<char> local_341;
  string local_340;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  undefined1 local_2d8 [8];
  cmNinjaBuild build;
  string local_198;
  allocator<char> local_161;
  string local_160;
  undefined1 local_140 [8];
  cmNinjaRule rule;
  ostream *os_local;
  cmGlobalNinjaGenerator *this_local;
  
  rule._288_8_ = os;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_160,"HELP",&local_161);
  cmNinjaRule::cmNinjaRule((cmNinjaRule *)local_140,&local_160);
  std::__cxx11::string::~string((string *)&local_160);
  std::allocator<char>::~allocator(&local_161);
  NinjaCmd_abi_cxx11_((string *)((long)&build.RspFile.field_2 + 8),this);
  cmStrCat<std::__cxx11::string,char_const(&)[12]>
            (&local_198,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&build.RspFile.field_2 + 8),(char (*) [12])" -t targets");
  std::__cxx11::string::operator=
            ((string *)(rule.Name.field_2._M_local_buf + 8),(string *)&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)(build.RspFile.field_2._M_local_buf + 8));
  std::__cxx11::string::operator=
            ((string *)(rule.Command.field_2._M_local_buf + 8),"All primary targets available:");
  std::__cxx11::string::operator=
            ((string *)(rule.Description.field_2._M_local_buf + 8),
             "Rule for printing all primary targets available.");
  os_00 = std::unique_ptr<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>::
          operator*(&this->RulesFileStream);
  WriteRule((ostream *)os_00,(cmNinjaRule *)local_140);
  cmNinjaRule::~cmNinjaRule((cmNinjaRule *)local_140);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"HELP",&local_2f9);
  cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_2d8,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::operator=((string *)local_2d8,"Print all primary targets available.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_340,"help",&local_341);
  NinjaOutputPath(&local_320,this,&local_340);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&build.Rule.field_2 + 8),&local_320);
  std::__cxx11::string::~string((string *)&local_320);
  std::__cxx11::string::~string((string *)&local_340);
  std::allocator<char>::~allocator(&local_341);
  WriteBuild(this,(ostream *)rule._288_8_,(cmNinjaBuild *)local_2d8,0,(bool *)0x0);
  cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_2d8);
  return;
}

Assistant:

void cmGlobalNinjaGenerator::WriteTargetHelp(std::ostream& os)
{
  {
    cmNinjaRule rule("HELP");
    rule.Command = cmStrCat(this->NinjaCmd(), " -t targets");
    rule.Description = "All primary targets available:";
    rule.Comment = "Rule for printing all primary targets available.";
    WriteRule(*this->RulesFileStream, rule);
  }
  {
    cmNinjaBuild build("HELP");
    build.Comment = "Print all primary targets available.";
    build.Outputs.push_back(this->NinjaOutputPath("help"));
    this->WriteBuild(os, build);
  }
}